

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void __thiscall
duckdb_re2::CharClassBuilder::AddRangeFlags
          (CharClassBuilder *this,Rune lo,Rune hi,ParseFlags parse_flags)

{
  do {
    if (((hi < 10) || ((parse_flags & (NeverNL|ClassNL)) == ClassNL)) || (10 < lo)) {
      if ((parse_flags & FoldCase) == NoParseFlags) {
        AddRange(this,lo,hi);
        return;
      }
      AddFoldedRange(this,lo,hi,0);
      return;
    }
    if (lo < 10) {
      AddRangeFlags(this,lo,9,parse_flags);
    }
    lo = 0xb;
  } while (10 < (uint)hi);
  return;
}

Assistant:

void CharClassBuilder::AddRangeFlags(
    Rune lo, Rune hi, Regexp::ParseFlags parse_flags) {

  // Take out \n if the flags say so.
  bool cutnl = !(parse_flags & Regexp::ClassNL) ||
               (parse_flags & Regexp::NeverNL);
  if (cutnl && lo <= '\n' && '\n' <= hi) {
    if (lo < '\n')
      AddRangeFlags(lo, '\n' - 1, parse_flags);
    if (hi > '\n')
      AddRangeFlags('\n' + 1, hi, parse_flags);
    return;
  }

  // If folding case, add fold-equivalent characters too.
  if (parse_flags & Regexp::FoldCase)
    AddFoldedRange(this, lo, hi, 0);
  else
    AddRange(lo, hi);
}